

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int int32_put(cram_block *b,int32_t val)

{
  ulong uVar1;
  uchar *puVar2;
  ulong uVar3;
  size_t sVar4;
  size_t __size;
  undefined1 auVar5 [16];
  double dVar6;
  
  uVar1 = b->alloc;
  sVar4 = b->byte;
  if (uVar1 <= sVar4 + 4) {
    do {
      auVar5._8_4_ = (int)(uVar1 >> 0x20);
      auVar5._0_8_ = uVar1;
      auVar5._12_4_ = 0x45300000;
      dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 1.5;
      uVar3 = (ulong)dVar6;
      __size = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
      if (uVar1 == 0) {
        __size = 0x400;
      }
      b->alloc = __size;
      puVar2 = (uchar *)realloc(b->data,__size);
      b->data = puVar2;
      uVar1 = b->alloc;
      sVar4 = b->byte;
    } while (uVar1 <= sVar4 + 4);
  }
  *(int32_t *)(b->data + sVar4) = val;
  b->byte = b->byte + 4;
  return -(uint)(b->data == (uchar *)0x0);
}

Assistant:

int int32_put(cram_block *b, int32_t val) {
    unsigned char cp[4];
    cp[0] = ( val      & 0xff);
    cp[1] = ((val>>8)  & 0xff);
    cp[2] = ((val>>16) & 0xff);
    cp[3] = ((val>>24) & 0xff);

    BLOCK_APPEND(b, cp, 4);
    return b->data ? 0 : -1;
}